

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind_def.cpp
# Opt level: O0

OmegaOP * slopeOP(vector<double,_std::allocator<double>_> *data,
                 vector<double,_std::allocator<double>_> *states,double penalty,string *constraint,
                 double minAngle,string *type)

{
  double firstdata;
  bool bVar1;
  OmegaOP *this;
  reference pvVar2;
  size_type sVar3;
  OmegaOP *omega;
  string *type_local;
  double minAngle_local;
  string *constraint_local;
  double penalty_local;
  vector<double,_std::allocator<double>_> *states_local;
  vector<double,_std::allocator<double>_> *data_local;
  
  this = (OmegaOP *)operator_new(0x78);
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](data,0);
  firstdata = *pvVar2;
  sVar3 = std::vector<double,_std::allocator<double>_>::size(data);
  OmegaOP::OmegaOP(this,states,firstdata,penalty,(uint)sVar3);
  bVar1 = std::operator==(type,"null");
  if ((bVar1) && (bVar1 = std::operator==(constraint,"null"), bVar1)) {
    OmegaOP::algo(this,data);
  }
  bVar1 = std::operator==(type,"channel");
  if ((bVar1) && (bVar1 = std::operator==(constraint,"null"), bVar1)) {
    OmegaOP::algoChannel(this,data);
  }
  bVar1 = std::operator==(type,"pruning");
  if ((bVar1) && (bVar1 = std::operator==(constraint,"null"), bVar1)) {
    OmegaOP::algoPruning(this,data);
  }
  bVar1 = std::operator==(constraint,"isotonic");
  if (bVar1) {
    OmegaOP::algoISOTONIC(this,data);
  }
  bVar1 = std::operator==(constraint,"unimodal");
  if (bVar1) {
    OmegaOP::algoUNIMODAL(this,data);
  }
  bVar1 = std::operator==(constraint,"smoothing");
  if (bVar1) {
    OmegaOP::algoSMOOTHING(this,data,minAngle);
  }
  sVar3 = std::vector<double,_std::allocator<double>_>::size(data);
  OmegaOP::backtracking(this,(uint)sVar3);
  return this;
}

Assistant:

OmegaOP *slopeOP(std::vector<double> data, std::vector<double> states, double penalty,
               std::string constraint = "null", double minAngle = 0, std::string type = "channel")
{
    OmegaOP *omega = new OmegaOP(states, data[0], penalty, data.size());

    //DIFFERENT PRUNING + NO CONSTRAINT
    if(type == "null" && constraint == "null"){omega->algo(data);}
    if(type == "channel" && constraint == "null"){omega->algoChannel(data);}
    if(type == "pruning" && constraint == "null"){omega->algoPruning(data);}

    //DIFFERENT CONSTRAINTS
    if(constraint == "isotonic"){omega->algoISOTONIC(data);}
    if(constraint == "unimodal"){omega->algoUNIMODAL(data);}
    if(constraint == "smoothing"){omega->algoSMOOTHING(data, minAngle);}

    omega->backtracking(data.size());

    return omega;
}